

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *__ptr;
  long lVar6;
  ParamDictPrivate *pPVar7;
  bool bVar8;
  float fVar9;
  size_t sStack_60;
  int id;
  int len;
  DataReader *local_50;
  char vstr [16];
  
  local_50 = dr;
  clear(this);
  id = 0;
  do {
    while( true ) {
      iVar2 = (*local_50->_vptr_DataReader[2])(local_50,"%d=",&id);
      if (iVar2 != 1) {
        return 0;
      }
      if (id < -0x5b03) break;
      if (0x1f < id) goto LAB_00147181;
      iVar2 = (*local_50->_vptr_DataReader[2])(local_50,"%15s",vstr);
      if (iVar2 != 1) {
        __ptr = "ParamDict read value failed";
        sStack_60 = 0x1b;
LAB_00147154:
        fwrite(__ptr,sStack_60,1,_stderr);
        goto LAB_00147167;
      }
      bVar8 = vstr_is_float(vstr);
      if (bVar8) {
        fVar9 = vstr_to_float(vstr);
        this->d->params[id].field_1.f = fVar9;
        iVar2 = 3;
      }
      else {
        iVar3 = __isoc99_sscanf(vstr,"%d",&this->d->params[id].field_1);
        iVar2 = 2;
        if (iVar3 != 1) {
          __ptr = "ParamDict parse value failed";
          sStack_60 = 0x1c;
          goto LAB_00147154;
        }
      }
      this->d->params[id].type = iVar2;
    }
    iVar2 = -0x5b04 - id;
    bVar8 = (uint)id < 0xffffa4dd;
    id = iVar2;
    if (bVar8) {
LAB_00147181:
      fprintf(_stderr,"id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)",
              (ulong)(uint)id,0x20);
LAB_00147167:
      fputc(10,_stderr);
      return -1;
    }
    len = 0;
    iVar2 = (*local_50->_vptr_DataReader[2])(local_50,"%d",&len);
    if (iVar2 != 1) {
      fwrite("ParamDict read array length failed",0x22,1,_stderr);
      goto LAB_00147167;
    }
    Mat::create(&this->d->params[id].v,len,4,(Allocator *)0x0);
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < len; lVar4 = lVar4 + 1) {
      iVar2 = (*local_50->_vptr_DataReader[2])(local_50,",%15[^,\n ]",vstr);
      if (iVar2 != 1) {
        __ptr = "ParamDict read array element failed";
        sStack_60 = 0x23;
        goto LAB_00147154;
      }
      bVar8 = vstr_is_float(vstr);
      pPVar7 = this->d;
      lVar6 = (long)id;
      pvVar1 = pPVar7->params[lVar6].v.data;
      if (bVar8) {
        fVar9 = vstr_to_float(vstr);
        *(float *)((long)pvVar1 + lVar5) = fVar9;
        iVar2 = 6;
      }
      else {
        iVar2 = __isoc99_sscanf(vstr,"%d",(long)pvVar1 + lVar5);
        if (iVar2 != 1) {
          __ptr = "ParamDict parse array element failed";
          sStack_60 = 0x24;
          goto LAB_00147154;
        }
        pPVar7 = this->d;
        lVar6 = (long)id;
        iVar2 = 5;
      }
      pPVar7->params[lVar6].type = iVar2;
      lVar5 = lVar5 + 4;
    }
  } while( true );
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

    //     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read array length failed");
                return -1;
            }

            d->params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict read array element failed");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = d->params[id].v;
                    ptr[j] = vstr_to_float(vstr);
                }
                else
                {
                    int* ptr = d->params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse array element failed");
                        return -1;
                    }
                }

                d->params[id].type = is_float ? 6 : 5;
            }
        }
        else
        {
            char vstr[16];
            int nscan = dr.scan("%15s", vstr);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read value failed");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
            {
                d->params[id].f = vstr_to_float(vstr);
            }
            else
            {
                nscan = sscanf(vstr, "%d", &d->params[id].i);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }
            }

            d->params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}